

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

Var Js::JavascriptRegExp::EntrySymbolSplit(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  CharCount limit;
  undefined4 *puVar5;
  RecyclableObject *thisObj;
  JavascriptString *input;
  Var pvVar6;
  int in_stack_00000010;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x33d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bb1cdc;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x33e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bb1cdc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  thisObj = GetThisObject((Arguments *)local_40,L"RegExp.prototype[Symbol.match]",pSVar1);
  input = GetFirstStringArg((Arguments *)local_40,pSVar1);
  limit = 0xffffffff;
  if (2 < (local_40._0_4_ & 0xffffff)) {
    pvVar6 = Arguments::operator[]((Arguments *)local_40,2);
    BVar4 = JavascriptOperators::IsUndefinedObject(pvVar6);
    if (BVar4 == 0) {
      pvVar6 = Arguments::operator[]((Arguments *)local_40,2);
      limit = JavascriptConversion::ToUInt32(pvVar6,pSVar1);
    }
  }
  bVar3 = RegexHelper::IsResultNotUsed((uint)args.super_Arguments.Values._3_1_);
  pvVar6 = RegexHelper::RegexSplit(pSVar1,thisObj,input,limit,bVar3,(void *)0x0);
  return pvVar6;
}

Assistant:

Var JavascriptRegExp::EntrySymbolSplit(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, RegexSymbolSplit, scriptContext);

        RecyclableObject *thisObj = GetThisObject(args, _u("RegExp.prototype[Symbol.match]"), scriptContext);
        JavascriptString* string = GetFirstStringArg(args, scriptContext);

        // TODO: SPEC DEVIATION
        //
        // In RegexHelper::RegexSplit, we check if RegExp properties are overridden in order to determine
        // if the algorithm is observable. If it is, we go through the new ES6 algorithm, but otherwise, we
        // run the faster ES5 version.
        //
        // According to the spec, we're supposed to process "limit" after we use some of the RegExp properties.
        // However, there doesn't seem to be any reason why "limit" processing can't be pulled above the rest
        // in the spec. Therefore, we should see if such a spec update is OK. If not, this would have to be
        // moved to its correct place in the code.
        uint32 limit = (args.Info.Count < 3 || JavascriptOperators::IsUndefinedObject(args[2]))
            ? UINT_MAX
            : JavascriptConversion::ToUInt32(args[2], scriptContext);

        return RegexHelper::RegexSplit(
            scriptContext,
            thisObj,
            string,
            limit,
            RegexHelper::IsResultNotUsed(callInfo.Flags));
    }